

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O2

int slang::ast::TimingControl::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  SyntaxKind SVar1;
  Compilation *compilation;
  ulong uVar2;
  TimingControl *pTVar3;
  undefined4 in_register_0000003c;
  SignalEventExpressionSyntax *syntax;
  SourceRange sourceRange;
  ASTContext ctx;
  ASTContext local_48;
  
  syntax = (SignalEventExpressionSyntax *)CONCAT44(in_register_0000003c,__fd);
  local_48.scope.ptr = *(Scope **)__addr;
  local_48._8_8_ = *(undefined8 *)(__addr->sa_data + 6);
  uVar2._0_2_ = __addr[1].sa_family;
  uVar2._2_1_ = __addr[1].sa_data[0];
  uVar2._3_1_ = __addr[1].sa_data[1];
  uVar2._4_1_ = __addr[1].sa_data[2];
  uVar2._5_1_ = __addr[1].sa_data[3];
  uVar2._6_1_ = __addr[1].sa_data[4];
  uVar2._7_1_ = __addr[1].sa_data[5];
  local_48.instanceOrProc = *(Symbol **)(__addr[1].sa_data + 6);
  local_48.firstTempVar = *(TempVarSymbol **)(__addr + 2);
  local_48.randomizeDetails = *(RandomizeDetails **)(__addr[2].sa_data + 6);
  local_48.assertionInstance = *(AssertionInstanceDetails **)(__addr + 3);
  local_48.flags.m_bits = uVar2 | 0x10;
  compilation = (local_48.scope.ptr)->compilation;
  SVar1 = (syntax->super_EventExpressionSyntax).super_SequenceExprSyntax.super_SyntaxNode.kind;
  if ((SVar1 == OrSequenceExpr) || (SVar1 == ParenthesizedSequenceExpr)) {
    pTVar3 = EventListControl::fromSyntax(compilation,(SyntaxNode *)syntax,&local_48);
  }
  else if (SVar1 == SignalEventExpression) {
    pTVar3 = SignalEventControl::fromSyntax(compilation,syntax,&local_48);
  }
  else {
    if (SVar1 != SimpleSequenceExpr) {
      sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      ASTContext::addDiag(&local_48,(DiagCode)0x280008,sourceRange);
      pTVar3 = badCtrl(compilation,(TimingControl *)0x0);
      goto LAB_00229aee;
    }
    pTVar3 = SignalEventControl::fromSyntax
                       (compilation,(SimpleSequenceExprSyntax *)syntax,&local_48);
  }
  pTVar3->syntax = (SyntaxNode *)syntax;
LAB_00229aee:
  return (int)pTVar3;
}

Assistant:

TimingControl& TimingControl::bind(const SequenceExprSyntax& syntax, const ASTContext& context) {
    ASTContext ctx(context);
    ctx.flags |= ASTFlags::AssignmentDisallowed;

    auto& comp = ctx.getCompilation();
    TimingControl* result;
    switch (syntax.kind) {
        case SyntaxKind::SimpleSequenceExpr:
            result = &SignalEventControl::fromSyntax(comp, syntax.as<SimpleSequenceExprSyntax>(),
                                                     ctx);
            break;
        case SyntaxKind::ParenthesizedSequenceExpr:
            result = &EventListControl::fromSyntax(comp,
                                                   syntax.as<ParenthesizedSequenceExprSyntax>(),
                                                   ctx);
            break;
        case SyntaxKind::OrSequenceExpr:
            result = &EventListControl::fromSyntax(comp, syntax.as<BinarySequenceExprSyntax>(),
                                                   ctx);
            break;
        case SyntaxKind::SignalEventExpression:
            result = &SignalEventControl::fromSyntax(comp, syntax.as<SignalEventExpressionSyntax>(),
                                                     ctx);
            break;
        default:
            ctx.addDiag(diag::InvalidSyntaxInEventExpr, syntax.sourceRange());
            return badCtrl(comp, nullptr);
    }

    result->syntax = &syntax;
    return *result;
}